

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::flipAndUpdate(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int *nflips)

{
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar8;
  undefined8 uVar9;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  undefined4 uVar14;
  undefined4 uVar15;
  pointer pBVar11;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  int *piVar13;
  char cVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  pointer pnVar20;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar21;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar22;
  long lVar23;
  Status *pSVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  long lVar26;
  int32_t iVar27;
  SPxOut *pSVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  pointer pnVar34;
  uint *puVar35;
  pointer pnVar36;
  cpp_dec_float<200U,_int,_void> *pcVar37;
  uint *puVar38;
  cpp_dec_float<200U,_int,_void> *pcVar39;
  pointer pnVar40;
  cpp_dec_float<200U,_int,_void> *pcVar41;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar42;
  undefined1 uVar43;
  fpclass_type fVar44;
  int32_t iVar45;
  undefined1 uVar46;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar47;
  fpclass_type fVar48;
  long in_FS_OFFSET;
  byte bVar49;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId baseId;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  int local_f94;
  cpp_dec_float<200U,_int,_void> local_f88;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f08;
  long local_f00;
  undefined4 local_ef4;
  DataKey local_ef0;
  cpp_dec_float<200U,_int,_void> local_ee8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_e60;
  cpp_dec_float<200U,_int,_void> local_e58;
  cpp_dec_float<200U,_int,_void> local_dd8;
  cpp_dec_float<200U,_int,_void> local_d58;
  undefined4 local_cd8;
  uint uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  double local_cc8;
  undefined8 uStack_cc0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_cb8;
  int *local_cb0;
  long local_ca8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ca0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ba0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_820;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_720;
  cpp_dec_float<200U,_int,_void> local_6a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_620;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  uint local_a0 [28];
  
  bVar49 = 0;
  this_00 = &this->updPrimRhs;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(this_00);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_00,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  this_01 = &this->updPrimVec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_01,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  local_e60 = this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_00);
  local_cb8 = this_01;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_01);
  iVar19 = *nflips;
  if (iVar19 < 1) {
    local_f94 = 0;
  }
  else {
    local_cc8 = *(double *)(in_FS_OFFSET + -8);
    local_cd8 = SUB84(local_cc8,0);
    uStack_cc0 = 0;
    uStack_cd4 = (uint)((ulong)local_cc8 >> 0x20) ^ 0x80000000;
    uStack_cd0 = 0;
    uStack_ccc = 0x80000000;
    lVar23 = 0;
    lVar26 = 0;
    local_f94 = 0;
    local_f08 = this;
    local_cb0 = nflips;
    do {
      iVar19 = *(int *)((long)(&((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->val + 1) + lVar23);
      lVar33 = (long)iVar19;
      if (lVar33 < 0) {
        local_f94 = local_f94 + 1;
      }
      else {
        local_ee8.fpclass = cpp_dec_float_finite;
        local_ee8.prec_elem = 0x1c;
        local_ee8.data._M_elems[0] = 0;
        local_ee8.data._M_elems[1] = 0;
        local_ee8.data._M_elems[2] = 0;
        local_ee8.data._M_elems[3] = 0;
        local_ee8.data._M_elems[4] = 0;
        local_ee8.data._M_elems[5] = 0;
        local_ee8.data._M_elems[6] = 0;
        local_ee8.data._M_elems[7] = 0;
        local_ee8.data._M_elems[8] = 0;
        local_ee8.data._M_elems[9] = 0;
        local_ee8.data._M_elems[10] = 0;
        local_ee8.data._M_elems[0xb] = 0;
        local_ee8.data._M_elems[0xc] = 0;
        local_ee8.data._M_elems[0xd] = 0;
        local_ee8.data._M_elems[0xe] = 0;
        local_ee8.data._M_elems[0xf] = 0;
        local_ee8.data._M_elems[0x10] = 0;
        local_ee8.data._M_elems[0x11] = 0;
        local_ee8.data._M_elems[0x12] = 0;
        local_ee8.data._M_elems[0x13] = 0;
        local_ee8.data._M_elems[0x14] = 0;
        local_ee8.data._M_elems[0x15] = 0;
        local_ee8.data._M_elems[0x16] = 0;
        local_ee8.data._M_elems[0x17] = 0;
        local_ee8.data._M_elems[0x18] = 0;
        local_ee8.data._M_elems[0x19] = 0;
        local_ee8.data._M_elems._104_5_ = 0;
        local_ee8.data._M_elems[0x1b]._1_3_ = 0;
        local_ee8.exp = 0;
        local_ee8.neg = false;
        local_dd8.fpclass = cpp_dec_float_finite;
        local_dd8.prec_elem = 0x1c;
        local_dd8.data._M_elems[0] = 0;
        local_dd8.data._M_elems[1] = 0;
        local_dd8.data._M_elems[2] = 0;
        local_dd8.data._M_elems[3] = 0;
        local_dd8.data._M_elems[4] = 0;
        local_dd8.data._M_elems[5] = 0;
        local_dd8.data._M_elems[6] = 0;
        local_dd8.data._M_elems[7] = 0;
        local_dd8.data._M_elems[8] = 0;
        local_dd8.data._M_elems[9] = 0;
        local_dd8.data._M_elems[10] = 0;
        local_dd8.data._M_elems[0xb] = 0;
        local_dd8.data._M_elems[0xc] = 0;
        local_dd8.data._M_elems[0xd] = 0;
        local_dd8.data._M_elems[0xe] = 0;
        local_dd8.data._M_elems[0xf] = 0;
        local_dd8.data._M_elems[0x10] = 0;
        local_dd8.data._M_elems[0x11] = 0;
        local_dd8.data._M_elems[0x12] = 0;
        local_dd8.data._M_elems[0x13] = 0;
        local_dd8.data._M_elems[0x14] = 0;
        local_dd8.data._M_elems[0x15] = 0;
        local_dd8.data._M_elems[0x16] = 0;
        local_dd8.data._M_elems[0x17] = 0;
        local_dd8.data._M_elems[0x18] = 0;
        local_dd8.data._M_elems[0x19] = 0;
        local_dd8.data._M_elems._104_5_ = 0;
        local_dd8.data._M_elems[0x1b]._1_3_ = 0;
        local_dd8.exp = 0;
        local_dd8.neg = false;
        local_e58.fpclass = cpp_dec_float_finite;
        local_e58.prec_elem = 0x1c;
        local_e58.data._M_elems[0] = 0;
        local_e58.data._M_elems[1] = 0;
        local_e58.data._M_elems[2] = 0;
        local_e58.data._M_elems[3] = 0;
        local_e58.data._M_elems[4] = 0;
        local_e58.data._M_elems[5] = 0;
        local_e58.data._M_elems[6] = 0;
        local_e58.data._M_elems[7] = 0;
        local_e58.data._M_elems[8] = 0;
        local_e58.data._M_elems[9] = 0;
        local_e58.data._M_elems[10] = 0;
        local_e58.data._M_elems[0xb] = 0;
        local_e58.data._M_elems[0xc] = 0;
        local_e58.data._M_elems[0xd] = 0;
        local_e58.data._M_elems[0xe] = 0;
        local_e58.data._M_elems[0xf] = 0;
        local_e58.data._M_elems[0x10] = 0;
        local_e58.data._M_elems[0x11] = 0;
        local_e58.data._M_elems[0x12] = 0;
        local_e58.data._M_elems[0x13] = 0;
        local_e58.data._M_elems[0x14] = 0;
        local_e58.data._M_elems[0x15] = 0;
        local_e58.data._M_elems[0x16] = 0;
        local_e58.data._M_elems[0x17] = 0;
        local_e58.data._M_elems[0x18] = 0;
        local_e58.data._M_elems[0x19] = 0;
        local_e58.data._M_elems._104_5_ = 0;
        local_e58.data._M_elems[0x1b]._1_3_ = 0;
        local_e58.exp = 0;
        local_e58.neg = false;
        local_d58.fpclass = cpp_dec_float_finite;
        local_d58.prec_elem = 0x1c;
        local_d58.data._M_elems[0] = 0;
        local_d58.data._M_elems[1] = 0;
        local_d58.data._M_elems[2] = 0;
        local_d58.data._M_elems[3] = 0;
        local_d58.data._M_elems[4] = 0;
        local_d58.data._M_elems[5] = 0;
        local_d58.data._M_elems[6] = 0;
        local_d58.data._M_elems[7] = 0;
        local_d58.data._M_elems[8] = 0;
        local_d58.data._M_elems[9] = 0;
        local_d58.data._M_elems[10] = 0;
        local_d58.data._M_elems[0xb] = 0;
        local_d58.data._M_elems[0xc] = 0;
        local_d58.data._M_elems[0xd] = 0;
        local_d58.data._M_elems[0xe] = 0;
        local_d58.data._M_elems[0xf] = 0;
        local_d58.data._M_elems[0x10] = 0;
        local_d58.data._M_elems[0x11] = 0;
        local_d58.data._M_elems[0x12] = 0;
        local_d58.data._M_elems[0x13] = 0;
        local_d58.data._M_elems[0x14] = 0;
        local_d58.data._M_elems[0x15] = 0;
        local_d58.data._M_elems[0x16] = 0;
        local_d58.data._M_elems[0x17] = 0;
        local_d58.data._M_elems[0x18] = 0;
        local_d58.data._M_elems[0x19] = 0;
        local_d58.data._M_elems._104_5_ = 0;
        local_d58.data._M_elems[0x1b]._1_3_ = 0;
        local_d58.exp = 0;
        local_d58.neg = false;
        local_f00 = lVar23;
        local_ca8 = lVar26;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_d58,0.0);
        pSVar22 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_ee8,0);
        pSVar47 = local_f08;
        iVar3 = *(int *)((long)&((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->src + local_f00);
        if (iVar3 == -1) {
          pSVar10 = (this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver;
          local_ef0 = (pSVar10->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).theBaseId.data[lVar33].super_DataKey;
          iVar3 = local_f94;
          if (local_ef0.info < 0) {
            SPxRowId::SPxRowId((SPxRowId *)&local_f88,(SPxId *)&local_ef0);
            iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar10->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&local_f88);
            pSVar47 = local_f08;
            pSVar24 = (pSVar22->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
            lVar23 = (long)iVar18;
            SVar4 = pSVar24[lVar23];
            pSVar22 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar23;
            pcVar37 = &local_dd8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar18 = pnVar20[lVar23].m_backend.exp;
            local_dd8.exp = iVar18;
            uVar43 = pnVar20[lVar23].m_backend.neg;
            local_dd8.neg = (bool)uVar43;
            fVar44 = pnVar20[lVar23].m_backend.fpclass;
            iVar27 = pnVar20[lVar23].m_backend.prec_elem;
            local_dd8.prec_elem = iVar27;
            local_dd8.fpclass = fVar44;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar23;
            pcVar37 = &local_e58;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar29 = pnVar20[lVar23].m_backend.exp;
            local_e58.exp = iVar29;
            uVar46 = pnVar20[lVar23].m_backend.neg;
            local_e58.neg = (bool)uVar46;
            fVar48 = pnVar20[lVar23].m_backend.fpclass;
            iVar45 = pnVar20[lVar23].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) goto LAB_005ca18e;
            if (SVar4 == P_ON_UPPER) goto LAB_005c9d69;
            pSVar28 = pSVar22->spxout;
            this = local_f08;
            iVar3 = local_f94 + 1;
            if ((pSVar28 != (SPxOut *)0x0) && (0 < (int)pSVar28->m_verbosity)) {
              local_f88.data._M_elems[0] = pSVar28->m_verbosity;
              local_ef4 = 1;
              (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_ef4);
              pSVar28 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity],"unexpected basis status: ",0x19);
              std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],SVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," index: ",8);
              std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],iVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," val: ",6);
              pnVar20 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar36 = pnVar20 + lVar33;
              pnVar25 = &local_720;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar25->m_backend).data._M_elems[0] = *(uint *)&pnVar36->m_backend;
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_720.m_backend.exp = pnVar20[lVar33].m_backend.exp;
              local_720.m_backend.neg = pnVar20[lVar33].m_backend.neg;
              local_720.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
              local_720.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar28->m_streams[pSVar28->m_verbosity],&local_720)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," upd: ",6);
              pnVar20 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theFvec->thedelta).
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar36 = pnVar20 + lVar33;
              pnVar25 = &local_7a0;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar25->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_7a0.m_backend.exp = pnVar20[lVar33].m_backend.exp;
              local_7a0.m_backend.neg = pnVar20[lVar33].m_backend.neg;
              local_7a0.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
              local_7a0.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
              boost::multiprecision::operator<<(pSVar28->m_streams[pSVar28->m_verbosity],&local_7a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," lower: ",8);
              pcVar37 = &local_e58;
              pnVar25 = &local_820;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_820.m_backend.exp = local_e58.exp;
              local_820.m_backend.neg = local_e58.neg;
              local_820.m_backend.fpclass = local_e58.fpclass;
              local_820.m_backend.prec_elem = local_e58.prec_elem;
              boost::multiprecision::operator<<(pSVar28->m_streams[pSVar28->m_verbosity],&local_820)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," upper: ",8);
              pcVar37 = &local_dd8;
              pnVar25 = &local_8a0;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_8a0.m_backend.exp = local_dd8.exp;
              local_8a0.m_backend.neg = local_dd8.neg;
              local_8a0.m_backend.fpclass = local_dd8.fpclass;
              local_8a0.m_backend.prec_elem = local_dd8.prec_elem;
              boost::multiprecision::operator<<(pSVar28->m_streams[pSVar28->m_verbosity],&local_8a0)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar28->m_streams[pSVar28->m_verbosity]," bp.val: ",9);
              pBVar11 = (pSVar47->breakpoints).data.
                        super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar25 = &local_920;
              puVar38 = (uint *)((long)(pBVar11->val).m_backend.data._M_elems + local_f00);
              pnVar42 = pnVar25;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar42->m_backend).data._M_elems[0] = *puVar38;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              local_920.m_backend.exp =
                   *(int *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00);
              local_920.m_backend.neg =
                   *(bool *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 4U);
              local_920.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 8U);
              goto LAB_005cb019;
            }
          }
          else {
            SPxColId::SPxColId((SPxColId *)&local_f88,(SPxId *)&local_ef0);
            iVar18 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar10->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&local_f88);
            pSVar47 = local_f08;
            pSVar24 = (pSVar22->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
            lVar23 = (long)iVar18;
            SVar4 = pSVar24[lVar23];
            pSVar22 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar23;
            pcVar37 = &local_dd8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar18 = pnVar20[lVar23].m_backend.exp;
            local_dd8.exp = iVar18;
            uVar43 = pnVar20[lVar23].m_backend.neg;
            local_dd8.neg = (bool)uVar43;
            fVar44 = pnVar20[lVar23].m_backend.fpclass;
            iVar27 = pnVar20[lVar23].m_backend.prec_elem;
            local_dd8.prec_elem = iVar27;
            local_dd8.fpclass = fVar44;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar23;
            pcVar37 = &local_e58;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar29 = pnVar20[lVar23].m_backend.exp;
            local_e58.exp = iVar29;
            uVar46 = pnVar20[lVar23].m_backend.neg;
            local_e58.neg = (bool)uVar46;
            fVar48 = pnVar20[lVar23].m_backend.fpclass;
            iVar45 = pnVar20[lVar23].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) {
LAB_005ca18e:
              pSVar24[lVar23] = P_ON_UPPER;
              pcVar37 = &local_e58;
              pcVar39 = &local_f88;
              local_e58.exp = iVar29;
              local_e58.neg = (bool)uVar46;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar45;
              local_f88.fpclass = fVar48;
              local_f88.exp = iVar29;
              local_f88.neg = (bool)uVar46;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_dd8);
              this = local_f08;
              pcVar37 = &local_f88;
              pcVar39 = &local_ee8;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar22 = (local_f08->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver;
              pnVar20 = (pSVar22->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar33;
              iVar18 = *(int *)&(pnVar20->m_backend).data;
              puVar38 = (pnVar20->m_backend).data._M_elems + 1;
              pcVar37 = &local_f88;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar37->data)._M_elems[0] = *puVar38;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar7 = (pnVar20->m_backend).fpclass;
              uVar15 = (pnVar20->m_backend).prec_elem;
              bVar1 = (pnVar20->m_backend).neg;
              iVar29 = (pnVar20->m_backend).exp;
              pnVar20 = (pSVar22->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar33;
              *(int *)&(pnVar20->m_backend).data = iVar18;
              pcVar37 = &local_f88;
              puVar38 = (pnVar20->m_backend).data._M_elems + 1;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                *puVar38 = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar20->m_backend).exp = iVar29;
              (pnVar20->m_backend).neg = (bool)((iVar18 != 0 || uVar7 != 0) ^ bVar1);
              (pnVar20->m_backend).fpclass = uVar7;
              (pnVar20->m_backend).prec_elem = uVar15;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
              pnVar20 = (((this->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar37 = &local_f88;
              pnVar36 = pnVar20 + lVar33;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar20[lVar33].m_backend.exp = local_f88.exp;
              pnVar20[lVar33].m_backend.neg = local_f88.neg;
              pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
              pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
            }
            else if (SVar4 == P_ON_UPPER) {
LAB_005c9d69:
              pSVar24[lVar23] = P_ON_LOWER;
              pcVar37 = &local_dd8;
              pcVar39 = &local_f88;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar27;
              local_f88.fpclass = fVar44;
              local_f88.exp = iVar18;
              local_f88.neg = (bool)uVar43;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_e58);
              this = local_f08;
              pcVar37 = &local_f88;
              pcVar39 = &local_ee8;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar22 = (local_f08->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver;
              pnVar20 = (pSVar22->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar33;
              iVar18 = *(int *)&(pnVar20->m_backend).data;
              puVar38 = (pnVar20->m_backend).data._M_elems + 1;
              pcVar37 = &local_f88;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar37->data)._M_elems[0] = *puVar38;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar6 = (pnVar20->m_backend).fpclass;
              uVar14 = (pnVar20->m_backend).prec_elem;
              bVar1 = (pnVar20->m_backend).neg;
              iVar29 = (pnVar20->m_backend).exp;
              pnVar20 = (pSVar22->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar33;
              *(int *)&(pnVar20->m_backend).data = iVar18;
              pcVar37 = &local_f88;
              puVar38 = (pnVar20->m_backend).data._M_elems + 1;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                *puVar38 = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar20->m_backend).exp = iVar29;
              (pnVar20->m_backend).neg = (bool)((iVar18 != 0 || uVar6 != 0) ^ bVar1);
              (pnVar20->m_backend).fpclass = uVar6;
              (pnVar20->m_backend).prec_elem = uVar14;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,
                         (double)CONCAT44(uStack_cd4,local_cd8));
              pnVar20 = (((this->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar37 = &local_f88;
              pnVar36 = pnVar20 + lVar33;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar20[lVar33].m_backend.exp = local_f88.exp;
              pnVar20[lVar33].m_backend.neg = local_f88.neg;
              pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
              pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
            }
            else {
              pSVar28 = pSVar22->spxout;
              this = local_f08;
              iVar3 = local_f94 + 1;
              if ((pSVar28 != (SPxOut *)0x0) && (0 < (int)pSVar28->m_verbosity)) {
                local_f88.data._M_elems[0] = pSVar28->m_verbosity;
                local_ef4 = 1;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_ef4);
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity],"FVEC unexpected status: ",0x18)
                ;
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],SVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],iVar19)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," val: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_9a0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = *(uint *)&pnVar36->m_backend;
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_9a0.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_9a0.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_9a0.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_9a0.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_9a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upd: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theFvec->thedelta).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_a20;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_a20.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_a20.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_a20.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_a20.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_a20);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," lower: ",8);
                pcVar37 = &local_e58;
                pnVar25 = &local_aa0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_aa0.m_backend.exp = local_e58.exp;
                local_aa0.m_backend.neg = local_e58.neg;
                local_aa0.m_backend.fpclass = local_e58.fpclass;
                local_aa0.m_backend.prec_elem = local_e58.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_aa0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upper: ",8);
                pcVar37 = &local_dd8;
                pnVar25 = &local_b20;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_b20.m_backend.exp = local_dd8.exp;
                local_b20.m_backend.neg = local_dd8.neg;
                local_b20.m_backend.fpclass = local_dd8.fpclass;
                local_b20.m_backend.prec_elem = local_dd8.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_b20);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," bp.val: ",9);
                pBVar11 = (pSVar47->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar25 = &local_ba0;
                puVar38 = (uint *)((long)(pBVar11->val).m_backend.data._M_elems + local_f00);
                pnVar42 = pnVar25;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar42->m_backend).data._M_elems[0] = *puVar38;
                  puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                  pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_ba0.m_backend.exp =
                     *(int *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00);
                local_ba0.m_backend.neg =
                     *(bool *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 4U);
                local_ba0.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 8U);
LAB_005cb019:
                boost::multiprecision::operator<<(pSVar28->m_streams[pSVar28->m_verbosity],pnVar25);
                cVar16 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) +
                                cVar16);
                std::ostream::put(cVar16);
                std::ostream::flush();
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_f88);
                this = pSVar47;
                iVar3 = local_f94 + 1;
              }
            }
          }
          local_f94 = iVar3;
          pcVar37 = &local_ee8;
          puVar38 = local_a0;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            *puVar38 = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
          }
          iVar3 = (this->updPrimRhs).super_IdxSet.num;
          (this->updPrimRhs).super_IdxSet.num = iVar3 + 1;
          pnVar20 = (this->updPrimRhs).
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (this->updPrimRhs).super_IdxSet.idx[iVar3] = iVar19;
          puVar38 = local_a0;
          pnVar36 = pnVar20 + lVar33;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pnVar36->m_backend).data._M_elems[0] = *puVar38;
            puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
            pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
          }
          pnVar20[lVar33].m_backend.exp = local_ee8.exp;
          pnVar20[lVar33].m_backend.neg = local_ee8.neg;
          pnVar20[lVar33].m_backend.fpclass = local_ee8.fpclass;
          pnVar20[lVar33].m_backend.prec_elem = local_ee8.prec_elem;
          lVar23 = local_f00;
          lVar26 = local_ca8;
          nflips = local_cb0;
        }
        else {
          if (iVar3 == 1) {
            pDVar8 = (pSVar22->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thedesc.costat;
            SVar4 = pDVar8->data[lVar33];
            pSVar22 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar33;
            pcVar37 = &local_dd8;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar3 = pnVar20[lVar33].m_backend.exp;
            local_dd8.exp = iVar3;
            bVar1 = pnVar20[lVar33].m_backend.neg;
            local_dd8.neg = bVar1;
            fVar44 = pnVar20[lVar33].m_backend.fpclass;
            iVar27 = pnVar20[lVar33].m_backend.prec_elem;
            local_dd8.prec_elem = iVar27;
            local_dd8.fpclass = fVar44;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar33;
            pcVar37 = &local_e58;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar18 = pnVar20[lVar33].m_backend.exp;
            local_e58.exp = iVar18;
            bVar2 = pnVar20[lVar33].m_backend.neg;
            local_e58.neg = bVar2;
            fVar48 = pnVar20[lVar33].m_backend.fpclass;
            iVar45 = pnVar20[lVar33].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) {
              pDVar8->data[lVar33] = P_ON_UPPER;
              pcVar37 = &local_dd8;
              pcVar39 = &local_f88;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar27;
              local_f88.fpclass = fVar44;
              local_f88.exp = iVar3;
              local_f88.neg = bVar1;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_e58);
              pSVar47 = local_f08;
              pcVar37 = &local_f88;
              pcVar39 = &local_ee8;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar22 = (local_f08->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver;
              puVar38 = (pSVar22->theCoUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar33].m_backend.data._M_elems +
                        1;
              uVar30 = ((array_type *)(puVar38 + -1))->_M_elems[0];
              puVar35 = puVar38;
              pcVar37 = &local_f88;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar37->data)._M_elems[0] = *puVar35;
                puVar35 = puVar35 + (ulong)bVar49 * -2 + 1;
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
              }
              uVar9 = *(undefined8 *)(puVar38 + 0x1d);
              uVar17 = puVar38[0x1c];
              uVar5 = puVar38[0x1b];
              pnVar20 = (pSVar22->theCoLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar33;
              (pnVar20->m_backend).data._M_elems[0] = uVar30;
              pcVar37 = &local_f88;
              puVar38 = (pnVar20->m_backend).data._M_elems + 1;
              for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                *puVar38 = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
              }
              (pnVar20->m_backend).exp = uVar5;
              (pnVar20->m_backend).neg = (bool)((uVar30 != 0 || (int)uVar9 != 0) ^ (byte)uVar17);
              (pnVar20->m_backend).fpclass = (int)uVar9;
              (pnVar20->m_backend).prec_elem = (int)((ulong)uVar9 >> 0x20);
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
              pnVar20 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theCoUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar37 = &local_f88;
              pnVar36 = pnVar20 + lVar33;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar20[lVar33].m_backend.exp = local_f88.exp;
              pnVar20[lVar33].m_backend.neg = local_f88.neg;
              pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
              pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
              pVVar21 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->theCoLbound;
LAB_005ca0c3:
              pcVar39 = &(pVVar21->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar33].m_backend;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              pcVar37 = &local_ee8;
              if (&local_f88 != pcVar39) {
                pcVar41 = &local_f88;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar41->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                }
                local_f88.exp = local_ee8.exp;
                local_f88.neg = local_ee8.neg;
                local_f88.fpclass = local_ee8.fpclass;
                local_f88.prec_elem = local_ee8.prec_elem;
                pcVar37 = pcVar39;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_f88,pcVar37);
              pcVar37 = &local_f88;
              pcVar39 = &local_d58;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_d58.exp = local_f88.exp;
              local_d58.neg = local_f88.neg;
              local_d58.fpclass = local_f88.fpclass;
              local_d58.prec_elem = local_f88.prec_elem;
            }
            else {
              if (SVar4 == P_ON_UPPER) {
                pDVar8->data[lVar33] = P_ON_LOWER;
                pcVar37 = &local_e58;
                pcVar39 = &local_f88;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar39 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar39 + (ulong)bVar49 * -8 + 4);
                }
                local_f88.prec_elem = iVar45;
                local_f88.fpclass = fVar48;
                local_f88.exp = iVar18;
                local_f88.neg = bVar2;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&local_f88,&local_dd8);
                pSVar47 = local_f08;
                pcVar37 = &local_f88;
                pcVar39 = &local_ee8;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar39 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar39 + (ulong)bVar49 * -8 + 4);
                }
                local_ee8.exp = local_f88.exp;
                local_ee8.neg = local_f88.neg;
                local_ee8.fpclass = local_f88.fpclass;
                local_ee8.prec_elem = local_f88.prec_elem;
                pSVar22 = (local_f08->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver;
                puVar38 = (pSVar22->theCoLbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar33].m_backend.data._M_elems
                          + 1;
                uVar30 = ((array_type *)(puVar38 + -1))->_M_elems[0];
                puVar35 = puVar38;
                pcVar37 = &local_f88;
                for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar37->data)._M_elems[0] = *puVar35;
                  puVar35 = puVar35 + (ulong)bVar49 * -2 + 1;
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                }
                uVar9 = *(undefined8 *)(puVar38 + 0x1d);
                uVar17 = puVar38[0x1c];
                uVar5 = puVar38[0x1b];
                pnVar20 = (pSVar22->theCoUbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar33;
                (pnVar20->m_backend).data._M_elems[0] = uVar30;
                pcVar37 = &local_f88;
                puVar38 = (pnVar20->m_backend).data._M_elems + 1;
                for (lVar23 = 0x1b; lVar23 != 0; lVar23 = lVar23 + -1) {
                  *puVar38 = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                }
                (pnVar20->m_backend).exp = uVar5;
                (pnVar20->m_backend).neg = (bool)((uVar30 != 0 || (int)uVar9 != 0) ^ (byte)uVar17);
                (pnVar20->m_backend).fpclass = (int)uVar9;
                (pnVar20->m_backend).prec_elem = (int)((ulong)uVar9 >> 0x20);
                ::soplex::infinity::__tls_init();
                local_f88.fpclass = cpp_dec_float_finite;
                local_f88.prec_elem = 0x1c;
                local_f88.data._M_elems[0] = 0;
                local_f88.data._M_elems[1] = 0;
                local_f88.data._M_elems[2] = 0;
                local_f88.data._M_elems[3] = 0;
                local_f88.data._M_elems[4] = 0;
                local_f88.data._M_elems[5] = 0;
                local_f88.data._M_elems[6] = 0;
                local_f88.data._M_elems[7] = 0;
                local_f88.data._M_elems[8] = 0;
                local_f88.data._M_elems[9] = 0;
                local_f88.data._M_elems[10] = 0;
                local_f88.data._M_elems[0xb] = 0;
                local_f88.data._M_elems[0xc] = 0;
                local_f88.data._M_elems[0xd] = 0;
                local_f88.data._M_elems[0xe] = 0;
                local_f88.data._M_elems[0xf] = 0;
                local_f88.data._M_elems[0x10] = 0;
                local_f88.data._M_elems[0x11] = 0;
                local_f88.data._M_elems[0x12] = 0;
                local_f88.data._M_elems[0x13] = 0;
                local_f88.data._M_elems[0x14] = 0;
                local_f88.data._M_elems[0x15] = 0;
                local_f88.data._M_elems[0x16] = 0;
                local_f88.data._M_elems[0x17] = 0;
                local_f88.data._M_elems[0x18] = 0;
                local_f88.data._M_elems[0x19] = 0;
                local_f88.data._M_elems._104_5_ = 0;
                local_f88.data._M_elems[0x1b]._1_3_ = 0;
                local_f88.exp = 0;
                local_f88.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_f88,
                           (double)CONCAT44(uStack_cd4,local_cd8));
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theCoLbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar37 = &local_f88;
                pnVar36 = pnVar20 + lVar33;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                pnVar20[lVar33].m_backend.exp = local_f88.exp;
                pnVar20[lVar33].m_backend.neg = local_f88.neg;
                pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
                pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
                pVVar21 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theCoUbound;
                goto LAB_005ca0c3;
              }
              local_f94 = local_f94 + 1;
              pSVar28 = pSVar22->spxout;
              if ((pSVar28 != (SPxOut *)0x0) && (0 < (int)pSVar28->m_verbosity)) {
                local_f88.data._M_elems[0] = pSVar28->m_verbosity;
                local_ef0.info = 1;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_ef0);
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity],"COPVEC unexpected status: ",
                           0x1a);
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],SVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],iVar19)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," val: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_420;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = *(uint *)&pnVar36->m_backend;
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_420.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_420.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_420.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_420.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_420);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upd: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theCoPvec->thedelta).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_4a0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_4a0.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_4a0.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_4a0.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_4a0.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_4a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," lower: ",8);
                pcVar37 = &local_e58;
                pnVar25 = &local_520;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_520.m_backend.exp = local_e58.exp;
                local_520.m_backend.neg = local_e58.neg;
                local_520.m_backend.fpclass = local_e58.fpclass;
                local_520.m_backend.prec_elem = local_e58.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_520);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upper: ",8);
                pcVar37 = &local_dd8;
                pnVar25 = &local_5a0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_5a0.m_backend.exp = local_dd8.exp;
                local_5a0.m_backend.neg = local_dd8.neg;
                local_5a0.m_backend.fpclass = local_dd8.fpclass;
                local_5a0.m_backend.prec_elem = local_dd8.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_5a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," bp.val: ",9);
                pBVar11 = (pSVar47->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar38 = (uint *)((long)(pBVar11->val).m_backend.data._M_elems + local_f00);
                pnVar25 = &local_620;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = *puVar38;
                  puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_620.m_backend.exp =
                     *(int *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00);
                local_620.m_backend.neg =
                     *(bool *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 4U);
                local_620.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 8U);
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_620);
                cVar16 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) +
                                cVar16);
                std::ostream::put(cVar16);
                std::ostream::flush();
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_f88);
              }
            }
            pnVar20 = (pSVar47->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar33;
            pcVar37 = &local_f88;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar3 = pnVar20[lVar33].m_backend.exp;
            bVar1 = pnVar20[lVar33].m_backend.neg;
            uVar9._0_4_ = pnVar20[lVar33].m_backend.fpclass;
            uVar9._4_4_ = pnVar20[lVar33].m_backend.prec_elem;
            pcVar37 = &local_f88;
            pcVar39 = &local_6a0;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
              pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4);
            }
            local_6a0.exp = iVar3;
            local_6a0.neg = bVar1;
            local_6a0._120_8_ = uVar9;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_6a0,&local_ee8);
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::setValue(local_e60,iVar19,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_6a0);
            fVar44 = cpp_dec_float_NaN;
            if (local_d58.fpclass != cpp_dec_float_NaN) {
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,0.0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_d58,&local_f88);
              lVar23 = local_f00;
              lVar26 = local_ca8;
              nflips = local_cb0;
              this = pSVar47;
              if (iVar19 == 0) goto LAB_005cb34d;
              fVar44 = local_d58.fpclass;
            }
            pSVar22 = (pSVar47->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar25 = &local_ca0;
            pcVar37 = &local_d58;
            pnVar42 = pnVar25;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar42->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
              pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            local_ca0.m_backend.exp = local_d58.exp;
            local_ca0.m_backend.neg = local_d58.neg;
            local_ca0.m_backend.prec_elem = local_d58.prec_elem;
            local_ca0.m_backend.fpclass = fVar44;
          }
          else {
            lVar23 = local_f00;
            lVar26 = local_ca8;
            nflips = local_cb0;
            if (iVar3 != 0) goto LAB_005cb34d;
            pDVar8 = (pSVar22->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thedesc.stat;
            SVar4 = pDVar8->data[lVar33];
            pSVar22 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar33;
            pcVar37 = &local_dd8;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar3 = pnVar20[lVar33].m_backend.exp;
            local_dd8.exp = iVar3;
            bVar1 = pnVar20[lVar33].m_backend.neg;
            local_dd8.neg = bVar1;
            fVar44 = pnVar20[lVar33].m_backend.fpclass;
            iVar27 = pnVar20[lVar33].m_backend.prec_elem;
            local_dd8.prec_elem = iVar27;
            local_dd8.fpclass = fVar44;
            pnVar20 = (pSVar22->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar36 = pnVar20 + lVar33;
            pcVar37 = &local_e58;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            iVar18 = pnVar20[lVar33].m_backend.exp;
            local_e58.exp = iVar18;
            bVar2 = pnVar20[lVar33].m_backend.neg;
            local_e58.neg = bVar2;
            fVar48 = pnVar20[lVar33].m_backend.fpclass;
            iVar45 = pnVar20[lVar33].m_backend.prec_elem;
            local_e58.prec_elem = iVar45;
            local_e58.fpclass = fVar48;
            if (SVar4 == P_ON_LOWER) {
              pDVar8->data[lVar33] = P_ON_UPPER;
              pcVar37 = &local_dd8;
              pcVar39 = &local_f88;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_f88.prec_elem = iVar27;
              local_f88.fpclass = fVar44;
              local_f88.exp = iVar3;
              local_f88.neg = bVar1;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_f88,&local_e58);
              pSVar47 = local_f08;
              pcVar37 = &local_f88;
              pcVar39 = &local_ee8;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_ee8.exp = local_f88.exp;
              local_ee8.neg = local_f88.neg;
              local_ee8.fpclass = local_f88.fpclass;
              local_ee8.prec_elem = local_f88.prec_elem;
              pSVar22 = (local_f08->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver;
              pnVar20 = (pSVar22->theLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar36 = (pSVar22->theUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar34 = pnVar20 + lVar33;
              pnVar40 = pnVar36 + lVar33;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
                pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar49 * -2 + 1) * 4);
                pnVar40 = (pointer)((long)pnVar40 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar36[lVar33].m_backend.exp = pnVar20[lVar33].m_backend.exp;
              pnVar36[lVar33].m_backend.neg = pnVar20[lVar33].m_backend.neg;
              iVar27 = pnVar20[lVar33].m_backend.prec_elem;
              pnVar36[lVar33].m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
              pnVar36[lVar33].m_backend.prec_elem = iVar27;
              ::soplex::infinity::__tls_init();
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,
                         (double)CONCAT44(uStack_cd4,local_cd8));
              pnVar20 = (((pSVar47->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->theLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar37 = &local_f88;
              pnVar36 = pnVar20 + lVar33;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              }
              pnVar20[lVar33].m_backend.exp = local_f88.exp;
              pnVar20[lVar33].m_backend.neg = local_f88.neg;
              pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
              pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
              pVVar21 = ((pSVar47->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->theUbound;
LAB_005ca542:
              pcVar39 = &(pVVar21->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar33].m_backend;
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              pcVar37 = &local_ee8;
              if (&local_f88 != pcVar39) {
                pcVar41 = &local_f88;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar41->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar41 + (ulong)bVar49 * -8 + 4);
                }
                local_f88.exp = local_ee8.exp;
                local_f88.neg = local_ee8.neg;
                local_f88.fpclass = local_ee8.fpclass;
                local_f88.prec_elem = local_ee8.prec_elem;
                pcVar37 = pcVar39;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_f88,pcVar37);
              pcVar37 = &local_f88;
              pcVar39 = &local_d58;
              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4)
                ;
                pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar49 * -8 + 4)
                ;
              }
              local_d58.exp = local_f88.exp;
              local_d58.neg = local_f88.neg;
              local_d58.fpclass = local_f88.fpclass;
              local_d58.prec_elem = local_f88.prec_elem;
            }
            else {
              if (SVar4 == P_ON_UPPER) {
                pDVar8->data[lVar33] = P_ON_LOWER;
                pcVar37 = &local_e58;
                pcVar39 = &local_f88;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar39 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar39 + (ulong)bVar49 * -8 + 4);
                }
                local_f88.prec_elem = iVar45;
                local_f88.fpclass = fVar48;
                local_f88.exp = iVar18;
                local_f88.neg = bVar2;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&local_f88,&local_dd8);
                pSVar47 = local_f08;
                pcVar37 = &local_f88;
                pcVar39 = &local_ee8;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pcVar39->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pcVar39 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar39 + (ulong)bVar49 * -8 + 4);
                }
                local_ee8.exp = local_f88.exp;
                local_ee8.neg = local_f88.neg;
                local_ee8.fpclass = local_f88.fpclass;
                local_ee8.prec_elem = local_f88.prec_elem;
                pSVar22 = (local_f08->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver;
                pnVar20 = (pSVar22->theUbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = (pSVar22->theLbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar34 = pnVar20 + lVar33;
                pnVar40 = pnVar36 + lVar33;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
                  pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar40 = (pointer)((long)pnVar40 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                pnVar36[lVar33].m_backend.exp = pnVar20[lVar33].m_backend.exp;
                pnVar36[lVar33].m_backend.neg = pnVar20[lVar33].m_backend.neg;
                iVar27 = pnVar20[lVar33].m_backend.prec_elem;
                pnVar36[lVar33].m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                pnVar36[lVar33].m_backend.prec_elem = iVar27;
                ::soplex::infinity::__tls_init();
                local_f88.fpclass = cpp_dec_float_finite;
                local_f88.prec_elem = 0x1c;
                local_f88.data._M_elems[0] = 0;
                local_f88.data._M_elems[1] = 0;
                local_f88.data._M_elems[2] = 0;
                local_f88.data._M_elems[3] = 0;
                local_f88.data._M_elems[4] = 0;
                local_f88.data._M_elems[5] = 0;
                local_f88.data._M_elems[6] = 0;
                local_f88.data._M_elems[7] = 0;
                local_f88.data._M_elems[8] = 0;
                local_f88.data._M_elems[9] = 0;
                local_f88.data._M_elems[10] = 0;
                local_f88.data._M_elems[0xb] = 0;
                local_f88.data._M_elems[0xc] = 0;
                local_f88.data._M_elems[0xd] = 0;
                local_f88.data._M_elems[0xe] = 0;
                local_f88.data._M_elems[0xf] = 0;
                local_f88.data._M_elems[0x10] = 0;
                local_f88.data._M_elems[0x11] = 0;
                local_f88.data._M_elems[0x12] = 0;
                local_f88.data._M_elems[0x13] = 0;
                local_f88.data._M_elems[0x14] = 0;
                local_f88.data._M_elems[0x15] = 0;
                local_f88.data._M_elems[0x16] = 0;
                local_f88.data._M_elems[0x17] = 0;
                local_f88.data._M_elems[0x18] = 0;
                local_f88.data._M_elems[0x19] = 0;
                local_f88.data._M_elems._104_5_ = 0;
                local_f88.data._M_elems[0x1b]._1_3_ = 0;
                local_f88.exp = 0;
                local_f88.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_f88,local_cc8);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theUbound->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar37 = &local_f88;
                pnVar36 = pnVar20 + lVar33;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar36->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + (ulong)bVar49 * -8 + 4);
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                pnVar20[lVar33].m_backend.exp = local_f88.exp;
                pnVar20[lVar33].m_backend.neg = local_f88.neg;
                pnVar20[lVar33].m_backend.fpclass = local_f88.fpclass;
                pnVar20[lVar33].m_backend.prec_elem = local_f88.prec_elem;
                pVVar21 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theLbound;
                goto LAB_005ca542;
              }
              local_f94 = local_f94 + 1;
              pSVar28 = pSVar22->spxout;
              if ((pSVar28 != (SPxOut *)0x0) && (0 < (int)pSVar28->m_verbosity)) {
                local_f88.data._M_elems[0] = pSVar28->m_verbosity;
                local_ef0.info = 1;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_ef0);
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity],"PVEC unexpected status: ",0x18)
                ;
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],SVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar28->m_streams[pSVar28->m_verbosity],iVar19)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," val: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_120;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = *(uint *)&pnVar36->m_backend;
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_120.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_120.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_120.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_120.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_120);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upd: ",6);
                pnVar20 = (((pSVar47->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->thePvec->thedelta).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar36 = pnVar20 + lVar33;
                pnVar25 = &local_1a0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_1a0.m_backend.exp = pnVar20[lVar33].m_backend.exp;
                local_1a0.m_backend.neg = pnVar20[lVar33].m_backend.neg;
                local_1a0.m_backend.fpclass = pnVar20[lVar33].m_backend.fpclass;
                local_1a0.m_backend.prec_elem = pnVar20[lVar33].m_backend.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," lower: ",8);
                pcVar37 = &local_e58;
                pnVar25 = &local_220;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_220.m_backend.exp = local_e58.exp;
                local_220.m_backend.neg = local_e58.neg;
                local_220.m_backend.fpclass = local_e58.fpclass;
                local_220.m_backend.prec_elem = local_e58.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_220);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," upper: ",8);
                pcVar37 = &local_dd8;
                pnVar25 = &local_2a0;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
                  pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_2a0.m_backend.exp = local_dd8.exp;
                local_2a0.m_backend.neg = local_dd8.neg;
                local_2a0.m_backend.fpclass = local_dd8.fpclass;
                local_2a0.m_backend.prec_elem = local_dd8.prec_elem;
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_2a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar28->m_streams[pSVar28->m_verbosity]," bp.val: ",9);
                pBVar11 = (pSVar47->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar38 = (uint *)((long)(pBVar11->val).m_backend.data._M_elems + local_f00);
                pnVar25 = &local_320;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar25->m_backend).data._M_elems[0] = *puVar38;
                  puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                  pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
                }
                local_320.m_backend.exp =
                     *(int *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00);
                local_320.m_backend.neg =
                     *(bool *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 4U);
                local_320.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pBVar11->val).m_backend.data + 1) + local_f00 + 8U);
                boost::multiprecision::operator<<
                          (pSVar28->m_streams[pSVar28->m_verbosity],&local_320);
                cVar16 = (char)pSVar28->m_streams[pSVar28->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar28->m_streams[pSVar28->m_verbosity] + -0x18) +
                                cVar16);
                std::ostream::put(cVar16);
                std::ostream::flush();
                pSVar28 = ((pSVar47->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                (*pSVar28->_vptr_SPxOut[2])(pSVar28,&local_f88);
              }
            }
            pSVar22 = (pSVar47->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pcVar37 = &local_ee8;
            pnVar25 = &local_3a0;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar25->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar37 + ((ulong)bVar49 * -2 + 1) * 4);
              pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar25 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            local_3a0.m_backend.exp = local_ee8.exp;
            local_3a0.m_backend.neg = local_ee8.neg;
            local_3a0.m_backend.fpclass = local_ee8.fpclass;
            local_3a0.m_backend.prec_elem = local_ee8.prec_elem;
            pSVar12 = pSVar22->thevectors;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)local_e60,&local_3a0,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)((pSVar12->set).theitem + (pSVar12->set).thekey[lVar33].idx));
            fVar44 = cpp_dec_float_NaN;
            if (local_d58.fpclass != cpp_dec_float_NaN) {
              local_f88.fpclass = cpp_dec_float_finite;
              local_f88.prec_elem = 0x1c;
              local_f88.data._M_elems[0] = 0;
              local_f88.data._M_elems[1] = 0;
              local_f88.data._M_elems[2] = 0;
              local_f88.data._M_elems[3] = 0;
              local_f88.data._M_elems[4] = 0;
              local_f88.data._M_elems[5] = 0;
              local_f88.data._M_elems[6] = 0;
              local_f88.data._M_elems[7] = 0;
              local_f88.data._M_elems[8] = 0;
              local_f88.data._M_elems[9] = 0;
              local_f88.data._M_elems[10] = 0;
              local_f88.data._M_elems[0xb] = 0;
              local_f88.data._M_elems[0xc] = 0;
              local_f88.data._M_elems[0xd] = 0;
              local_f88.data._M_elems[0xe] = 0;
              local_f88.data._M_elems[0xf] = 0;
              local_f88.data._M_elems[0x10] = 0;
              local_f88.data._M_elems[0x11] = 0;
              local_f88.data._M_elems[0x12] = 0;
              local_f88.data._M_elems[0x13] = 0;
              local_f88.data._M_elems[0x14] = 0;
              local_f88.data._M_elems[0x15] = 0;
              local_f88.data._M_elems[0x16] = 0;
              local_f88.data._M_elems[0x17] = 0;
              local_f88.data._M_elems[0x18] = 0;
              local_f88.data._M_elems[0x19] = 0;
              local_f88.data._M_elems._104_5_ = 0;
              local_f88.data._M_elems[0x1b]._1_3_ = 0;
              local_f88.exp = 0;
              local_f88.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_f88,0.0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_d58,&local_f88);
              lVar23 = local_f00;
              lVar26 = local_ca8;
              nflips = local_cb0;
              this = pSVar47;
              if (iVar19 == 0) goto LAB_005cb34d;
              fVar44 = local_d58.fpclass;
            }
            pSVar22 = (pSVar47->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            pnVar25 = &local_c20;
            pcVar37 = &local_d58;
            pnVar42 = pnVar25;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar42->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
              pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar42 + ((ulong)bVar49 * -2 + 1) * 4);
            }
            local_c20.m_backend.exp = local_d58.exp;
            local_c20.m_backend.neg = local_d58.neg;
            local_c20.m_backend.prec_elem = local_d58.prec_elem;
            local_c20.m_backend.fpclass = fVar44;
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::updateNonbasicValue(pSVar22,pnVar25);
          lVar23 = local_f00;
          lVar26 = local_ca8;
          nflips = local_cb0;
          this = pSVar47;
        }
      }
LAB_005cb34d:
      lVar26 = lVar26 + 1;
      iVar19 = *nflips;
      lVar23 = lVar23 + 0x88;
    } while (lVar26 < iVar19);
  }
  *nflips = iVar19 - local_f94;
  if (iVar19 - local_f94 != 0 && local_f94 <= iVar19) {
    pSVar22 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    bVar1 = (this->updPrimRhs).setupStatus;
    if (pSVar22->theRep == ROW) {
      pVVar21 = pSVar22->theCoPrhs;
      if (bVar1 == false) {
        lVar26 = 0xa50;
        lVar23 = 0xa48;
        uVar30 = (uint)((ulong)((long)(pVVar21->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pVVar21->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar30) {
          uVar32 = (ulong)(uVar30 & 0x7fffffff);
          uVar31 = uVar32 + 1;
          lVar26 = uVar32 << 7;
          do {
            pnVar20 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar38 = (uint *)((long)pnVar20[-1].m_backend.data._M_elems + lVar26);
            pcVar37 = &local_f88;
            for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
              (pcVar37->data)._M_elems[0] = *puVar38;
              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = *(int *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26);
            local_f88.neg = *(bool *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26 + 4U);
            local_f88._120_8_ =
                 *(undefined8 *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pVVar21->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar26),&local_f88);
            uVar31 = uVar31 - 1;
            lVar26 = lVar26 + -0x80;
          } while (1 < uVar31);
          lVar26 = 0xa50;
        }
      }
      else {
        lVar33 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar26 = 0xa50;
        lVar23 = 0xa48;
        if (0 < lVar33) {
          uVar31 = lVar33 + 1;
          do {
            piVar13 = (this->updPrimRhs).super_IdxSet.idx;
            pnVar20 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar19 = piVar13[uVar31 - 2];
            pnVar36 = pnVar20 + iVar19;
            pcVar37 = &local_f88;
            for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = pnVar20[iVar19].m_backend.exp;
            local_f88.neg = pnVar20[iVar19].m_backend.neg;
            local_f88.fpclass = pnVar20[iVar19].m_backend.fpclass;
            local_f88.prec_elem = pnVar20[iVar19].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pVVar21->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar13[uVar31 - 2]].m_backend,
                       &local_f88);
            uVar31 = uVar31 - 1;
          } while (1 < uVar31);
        }
      }
    }
    else {
      pVVar21 = pSVar22->theFrhs;
      if (bVar1 == false) {
        lVar26 = 0xa30;
        lVar23 = 0xa28;
        uVar30 = (uint)((ulong)((long)(pVVar21->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pVVar21->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar30) {
          uVar32 = (ulong)(uVar30 & 0x7fffffff);
          uVar31 = uVar32 + 1;
          lVar26 = uVar32 << 7;
          do {
            pnVar20 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar38 = (uint *)((long)pnVar20[-1].m_backend.data._M_elems + lVar26);
            pcVar37 = &local_f88;
            for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
              (pcVar37->data)._M_elems[0] = *puVar38;
              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = *(int *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26);
            local_f88.neg = *(bool *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26 + 4U);
            local_f88._120_8_ =
                 *(undefined8 *)((long)(&pnVar20[-1].m_backend.data + 1) + lVar26 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pVVar21->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar26),&local_f88);
            uVar31 = uVar31 - 1;
            lVar26 = lVar26 + -0x80;
          } while (1 < uVar31);
          lVar26 = 0xa30;
        }
      }
      else {
        lVar33 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar26 = 0xa30;
        lVar23 = 0xa28;
        if (0 < lVar33) {
          uVar31 = lVar33 + 1;
          do {
            piVar13 = (this->updPrimRhs).super_IdxSet.idx;
            pnVar20 = (this->updPrimRhs).
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar19 = piVar13[uVar31 - 2];
            pnVar36 = pnVar20 + iVar19;
            pcVar37 = &local_f88;
            for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
              pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar49 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar49 * -8 + 4);
            }
            local_f88.exp = pnVar20[iVar19].m_backend.exp;
            local_f88.neg = pnVar20[iVar19].m_backend.neg;
            local_f88.fpclass = pnVar20[iVar19].m_backend.fpclass;
            local_f88.prec_elem = pnVar20[iVar19].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pVVar21->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar13[uVar31 - 2]].m_backend,
                       &local_f88);
            uVar31 = uVar31 - 1;
          } while (1 < uVar31);
        }
      }
    }
    pSVar22 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((long)&(pSVar22->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray + lVar23) = local_cb8;
    *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((long)&(pSVar22->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray + lVar26) = local_e60;
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}